

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.hpp
# Opt level: O2

void mserialize::detail::BuiltinSerializer<std::deque<char,_std::allocator<char>_>,_void>::
     serialize<OutputStream>(deque<char,_std::allocator<char>_> *s,OutputStream *ostream)

{
  size_type sVar1;
  
  sVar1 = std::deque<char,_std::allocator<char>_>::size(s);
  TrivialSerializer<unsigned_int>::serialize<OutputStream>((uint)sVar1,ostream);
  serialize_elems<OutputStream>(s,sVar1 & 0xffffffff,ostream);
  return;
}

Assistant:

static void serialize(const Sequence& s, OutputStream& ostream)
  {
    const auto size = sequence_size(s);
    const auto size32 = std::uint32_t(size);
    assert(size32 == size && "sequence size must fit on 32 bits");

    mserialize::serialize(size32, ostream);
    serialize_elems(is_sequence_batch_serializable<const Sequence>{}, s, size32, ostream);
  }